

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

void bhf::ads::ParseStringData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  char data;
  char *pcVar1;
  ostream *poVar2;
  runtime_error *this;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  pcVar1 = *it;
  do {
    data = *pcVar1;
    if (data == '\0') {
LAB_00128244:
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      if (*lineNumber == 0xffffffffffffffff) {
        poVar2 = std::operator<<(local_198,"Invalid network data: ");
        poVar2 = std::operator<<(poVar2,"missing closing quotation mark");
      }
      else {
        poVar2 = std::operator<<(local_198,"Invalid file format: ");
        poVar2 = std::operator<<(poVar2,"missing closing quotation mark");
        poVar2 = std::operator<<(poVar2," in line ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      }
      std::operator<<(poVar2,'\n');
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,asStack_1c8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (pcVar1[1] == '\0') {
      if (data == '\"') {
        RegistryEntry::PushData<char>(value,'\0');
        return;
      }
      goto LAB_00128244;
    }
    RegistryEntry::PushData<char>(value,data);
    pcVar1 = *it + 1;
    *it = pcVar1;
  } while( true );
}

Assistant:

static void ParseStringData(RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    // REG_SZ data should end with a closing quote and null terminator
    while ('\0' != it[0] && '\0' != it[1]) {
        value.PushData(*it);
        ++it;
    }
    if ('\"' != *it) {
        PARSING_EXCEPTION("missing closing quotation mark");
    }
    value.PushData('\0');
}